

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

void __thiscall VcprojGenerator::initDeploymentTool(VcprojGenerator *this)

{
  QMakeProject *pQVar1;
  QString string;
  QString string_00;
  QString string_01;
  Data *pDVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Data *pDVar6;
  qsizetype qVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQVar10;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQVar11;
  char cVar12;
  char cVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  longlong __old_val_1;
  ProStringList *pPVar17;
  ProStringList *pPVar18;
  QString *pQVar19;
  QList<ProString> *pQVar20;
  iterator iVar21;
  iterator iVar22;
  iterator this_00;
  iterator iVar23;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQVar24;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQVar25;
  uchar flags;
  QChar QVar26;
  long lVar27;
  ProString *dllPath;
  ProString *pPVar28;
  int iVar29;
  longlong __old_val;
  long in_FS_OFFSET;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QByteArrayView QVar34;
  QStringView QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QLatin1String QVar40;
  QFileInfo info;
  QDirListing dirList;
  QFileInfo info_1;
  ProStringList ret;
  ProStringList ret_1;
  ProStringList ret_2;
  VcprojGenerator *pVVar41;
  VcprojGenerator *pVVar42;
  undefined1 uVar43;
  undefined7 uVar44;
  QString local_298;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  local_278;
  DirEntry local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_208;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQStack_200;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_1f8;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [64];
  undefined1 local_188 [64];
  QArrayDataPointer<ProString> local_148;
  QArrayDataPointer<ProString> local_128;
  QArrayDataPointer<ProString> local_110;
  undefined1 local_f8 [32];
  undefined1 local_d8 [48];
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_a8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *pQStack_a0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_98;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
  *local_90;
  QString *local_88;
  qsizetype local_80;
  char *local_78;
  qsizetype local_70;
  char *local_68;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_d8,"deploy.path");
  pPVar17 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8);
  ProStringList::join((QString *)&local_278,pPVar17,(QChar)0x20);
  local_f8._8_8_ = local_278.a.a.a.a.a.d.ptr;
  local_f8._0_8_ = local_278.a.a.a.a.a.d.d;
  local_278.a.a.a.a.a.d.d = (Data *)0x0;
  local_278.a.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_f8._16_8_ = local_278.a.a.a.a.a.d.size;
  local_278.a.a.a.a.a.d.size = 0;
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_d8._0_8_ !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)local_d8._0_8_)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)local_d8._0_8_)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
    }
  }
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_f8._16_8_ ==
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    QVar39.m_data = (storage_type *)0x16;
    QVar39.m_size = (qsizetype)local_d8;
    QString::fromUtf8(QVar39);
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_188,"TARGET");
    QMakeEvaluator::first((ProString *)&local_278,&pQVar1->super_QMakeEvaluator,(ProKey *)local_188)
    ;
    ProString::ProString((ProString *)(local_d8 + 0x18),(ProString *)&local_278);
    QStringBuilder<QString,_ProString>::convertTo<QString>
              ((QString *)local_1c8,(QStringBuilder<QString,_ProString> *)local_d8);
    uVar9 = local_f8._8_8_;
    uVar8 = local_f8._0_8_;
    uVar5 = local_1c8._16_8_;
    uVar4 = local_1c8._0_8_;
    local_1c8._0_8_ = local_f8._0_8_;
    local_f8._0_8_ = uVar4;
    local_f8._8_8_ = local_1c8._8_8_;
    local_1c8._8_8_ = uVar9;
    local_1c8._16_8_ = local_f8._16_8_;
    local_f8._16_8_ = uVar5;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)uVar8 !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)uVar8)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)uVar8)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)uVar8)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    QStringBuilder<QString,_ProString>::~QStringBuilder
              ((QStringBuilder<QString,_ProString> *)local_d8);
    if (&(local_278.a.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_278.a.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_278.a.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_278.a.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_278.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_188._0_8_ !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)local_188._0_8_)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)local_188._0_8_)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_188._0_8_)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_188._0_8_,2,0x10);
      }
    }
  }
  QVar30.m_data = (storage_type *)0x1;
  QVar30.m_size = (qsizetype)local_d8;
  QString::fromUtf8(QVar30);
  local_278.a.a.a.a.a.d.d = (Data *)local_d8._0_8_;
  local_278.a.a.a.a.a.d.ptr = (char16_t *)local_d8._8_8_;
  local_278.a.a.a.a.a.d.size = local_d8._16_8_;
  cVar12 = QString::endsWith((QString *)local_f8,(CaseSensitivity)&local_278);
  cVar13 = '\x01';
  if (cVar12 == '\0') {
    QVar31.m_data = (storage_type *)0x1;
    QVar31.m_size = (qsizetype)local_d8;
    QString::fromUtf8(QVar31);
    local_188._0_8_ = local_d8._0_8_;
    local_188._8_8_ = local_d8._8_8_;
    local_188._16_8_ = local_d8._16_8_;
    cVar13 = QString::endsWith((QString *)local_f8,(CaseSensitivity)local_188);
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_188._0_8_ !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)local_188._0_8_)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)local_188._0_8_)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_188._0_8_)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_188._0_8_,2,0x10);
      }
    }
  }
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_278.a.a.a.a.a.d.d !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate(&(local_278.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (cVar13 != '\0') {
    QString::chop((longlong)local_f8);
  }
  pVVar41 = this;
  QString::operator=(&(this->vcProject).Configuration.deployment.RemoteDirectory,(QString *)local_f8
                    );
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_d8,"QMAKE_DLL_PATHS");
  pPVar17 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8);
  local_110.d = (pPVar17->super_QList<ProString>).d.d;
  local_110.ptr = (pPVar17->super_QList<ProString>).d.ptr;
  local_110.size = (pPVar17->super_QList<ProString>).d.size;
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_d8._0_8_ !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)local_d8._0_8_)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)local_d8._0_8_)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
    }
  }
  if (local_110.size != 0) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (pVVar41->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    pVVar42 = pVVar41;
    ProKey::ProKey((ProKey *)local_d8,"LIBS");
    pPVar17 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8);
    pQVar1 = (pVVar41->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_278,"LIBS_PRIVATE");
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_278);
    local_148.d = (pPVar17->super_QList<ProString>).d.d;
    local_148.ptr = (pPVar17->super_QList<ProString>).d.ptr;
    local_148.size = (pPVar17->super_QList<ProString>).d.size;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_148.d !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)local_148.d)->a).a.a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)local_148.d)->a).a.a.a.a.d.d + 1;
      UNLOCK();
    }
    pPVar28 = (pPVar18->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)(local_188 + 0x40),pPVar28,
               pPVar28 + (pPVar18->super_QList<ProString>).d.size);
    pQVar1 = (pVVar42->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_188,"QMAKE_LIBS");
    pPVar17 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_188);
    local_128.d = local_148.d;
    local_128.ptr = local_148.ptr;
    local_128.size = local_148.size;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_148.d !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)&(local_148.d)->super_QArrayData)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)&(local_148.d)->super_QArrayData)->a).a.a.a.d.d + 1;
      UNLOCK();
    }
    pPVar28 = (pPVar17->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)&local_128,pPVar28,
               pPVar28 + (pPVar17->super_QList<ProString>).d.size);
    pQVar1 = (pVVar42->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_1c8,"QMAKE_LIBS_PRIVATE");
    pPVar17 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_1c8);
    local_58.d = local_128.d;
    local_58.ptr = local_128.ptr;
    local_58.size = local_128.size;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_128.d !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d + 1;
      UNLOCK();
    }
    pPVar28 = (pPVar17->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)&local_58,pPVar28,
               pPVar28 + (pPVar17->super_QList<ProString>).d.size);
    pVVar41 = pVVar42;
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_1c8._0_8_ !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)local_1c8._0_8_)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)local_1c8._0_8_)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_1c8._0_8_)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
        pVVar41 = pVVar42;
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_128);
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_188._0_8_ !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)local_188._0_8_)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)local_188._0_8_)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_188._0_8_)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_188._0_8_,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer
              ((QArrayDataPointer<ProString> *)(local_188 + 0x40));
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_278.a.a.a.a.a.d.d !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate(&(local_278.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_d8._0_8_ !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                  *)local_d8._0_8_)->a).a.a.a.d.d =
           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                       *)local_d8._0_8_)->a).a.a.a.d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
      }
    }
    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)local_58.size !=
        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
         *)0x0) {
      pQVar19 = &(pVVar41->vcProject).Configuration.deployment.AdditionalFiles;
      bVar15 = 0;
      pQVar25 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_58.ptr;
      do {
        local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_128.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
        ProString::toQString((QString *)&local_128,(ProString *)pQVar25);
        QString::replace((QChar)(char16_t)&local_128,(QChar)0x5c,0x2f);
        QVar32.m_data = (char *)0x9;
        QVar32.m_size = (qsizetype)&local_128;
        cVar12 = QString::startsWith(QVar32,0x2b49a9);
        if (cVar12 == '\0') {
          QVar33.m_data = (char *)0x4;
          QVar33.m_size = (qsizetype)&local_128;
          cVar12 = QString::endsWith(QVar33,0x2b460f);
          if (cVar12 != '\0') {
            pQVar10 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)(local_128.size + -0x50);
            QVar34.m_data = (storage_type *)0x3;
            QVar34.m_size = (qsizetype)local_d8;
            QString::fromLatin1(QVar34);
            local_278.a.a.a.a.a.d.d = (Data *)local_d8._0_8_;
            local_278.a.a.a.a.a.d.ptr = (char16_t *)local_d8._8_8_;
            local_278.a.a.a.a.a.d.size = local_d8._16_8_;
            QString::replace((longlong)&local_128,(longlong)((long)&(pQVar10->b).d.size + 5),
                             (QString *)0x3);
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_278.a.a.a.a.a.d.d !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate(&(local_278.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          QVar35.m_data = (storage_type_conflict *)local_128.ptr;
          QVar35.m_size = local_128.size;
          QtPrivate::lastIndexOf(QVar35,-1,L'/',CaseSensitive);
          QString::remove((longlong)&local_128,0);
          local_298.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_298);
          if (local_110.size != 0) {
            lVar27 = local_110.size * 0x30;
            pPVar28 = local_110.ptr;
            do {
              lVar27 = lVar27 + -0x30;
              local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              ProString::toQString((QString *)local_d8,pPVar28);
              QVar26.ucs = (char16_t)
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
                            *)local_d8;
              cVar12 = QString::endsWith(QVar26,0x2f);
              if (cVar12 == '\0') {
                QString::append(QVar26);
              }
              QString::append((QString *)local_d8);
              QFileInfo::QFileInfo((QFileInfo *)&local_278,(QString *)local_d8);
              pDVar2 = local_298.d.d;
              local_298.d.d = local_278.a.a.a.a.a.d.d;
              local_278.a.a.a.a.a.d.d = pDVar2;
              QFileInfo::~QFileInfo((QFileInfo *)&local_278);
              bVar14 = QFileInfo::exists();
              if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)local_d8._0_8_ !=
                  (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)0x0) {
                LOCK();
                *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)local_d8._0_8_)->a).a.a.a.d.d =
                     *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                 *)local_d8._0_8_)->a).a.a.a.d.d + -1;
                UNLOCK();
                if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
                  QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                }
              }
              pPVar28 = pPVar28 + 1;
            } while ((bVar14 | lVar27 == 0) != 1);
          }
          cVar12 = QFileInfo::exists();
          if (cVar12 != '\0') {
            QFileInfo::fileName();
            qVar3 = local_148.size;
            pPVar28 = local_148.ptr;
            pDVar6 = local_148.d;
            local_148.size = 0;
            local_148.d = (Data *)0x0;
            local_148.ptr = (ProString *)0x0;
            QFileInfo::absolutePath();
            QDir::toNativeSeparators((QString *)local_1e8);
            local_a8 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)local_1e8._16_8_;
            local_d8._40_8_ = local_1e8._8_8_;
            local_d8._32_8_ = local_1e8._0_8_;
            local_1c8._24_8_ = "|";
            local_1e8._16_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1c8._0_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1c8._8_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1c8._16_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_188._24_8_ = "|";
            local_1c8._32_8_ = (QString *)0x0;
            local_1c8._40_8_ = (char (*) [2])0x0;
            local_1c8._48_8_ = (QString *)0x0;
            local_188._56_8_ = "|";
            local_188._0_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_188._8_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_188._16_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_278.a.a.a.a.b = (char (*) [2])0x2ac369;
            local_188._32_8_ = (QString *)0x0;
            local_188._40_8_ = (char (*) [2])0x0;
            local_188._48_8_ = (QString *)0x0;
            local_278.b.d.d = (Data *)0x2ac369;
            local_278.b.d.ptr = (char16_t *)local_f8;
            local_278.a.a.a.a.a.d.d = (Data *)0x0;
            local_278.a.a.a.a.a.d.ptr = (char16_t *)0x0;
            local_d8._0_8_ = pDVar6;
            local_d8._8_8_ = pPVar28;
            local_278.a.a.a.a.a.d.size = 0;
            local_d8._16_8_ = qVar3;
            local_d8._24_8_ = "|";
            local_278.a.a.a.b = (QString *)0x0;
            local_278.a.a.b = (char (*) [2])0x0;
            local_1e8._0_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_1e8._8_8_ =
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *)0x0;
            local_278.a.b = (QString *)0x0;
            pQStack_a0 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)0x2ac369;
            local_90 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x2b4a01;
            local_98 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)local_278.b.d.ptr;
            ::operator+=(pQVar19,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[4]>
                                  *)local_d8);
            QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                       local_d8);
            QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                       &local_278);
            QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                       local_188);
            QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                       local_1c8);
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_1e8._0_8_ !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_1e8._0_8_)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)local_1e8._0_8_)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)local_1e8._0_8_)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate((QArrayData *)local_1e8._0_8_,2,0x10);
              }
            }
            if (local_208 !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(local_208->a).a.a.a.a.d.d = *(int *)&(local_208->a).a.a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(local_208->a).a.a.a.a.d.d == 0) {
                QArrayData::deallocate((QArrayData *)local_208,2,0x10);
              }
            }
            if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_148.d !=
                (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_148.d)->super_QArrayData)->a).a.a.a.d.d =
                   *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                               *)&(local_148.d)->super_QArrayData)->a).a.a.a.d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                              *)&(local_148.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
                QArrayData::deallocate(&(local_148.d)->super_QArrayData,2,0x10);
              }
            }
            bVar14 = bVar15 & 1;
            bVar15 = 1;
            if (bVar14 == 0) {
              local_278.a.a.a.a.a.d.d = (Data *)0x0;
              local_278.a.a.a.a.a.d.ptr = (char16_t *)0x0;
              local_278.a.a.a.a.a.d.size = 0;
              QVar36.m_data = (char *)0x4;
              QVar36.m_size = (qsizetype)&local_128;
              lVar27 = QString::indexOf(QVar36,0x2b00b5,CaseInsensitive);
              if (lVar27 == -1) {
                QVar37.m_data = (char *)0x3;
                QVar37.m_size = (qsizetype)&local_128;
                lVar27 = QString::indexOf(QVar37,0x2b4a05,CaseInsensitive);
                if (lVar27 != -1) goto LAB_00249f2b;
                bVar15 = 0;
              }
              else {
                QString::operator=((QString *)&local_278,(QChar)0x64);
LAB_00249f2b:
                local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                QFileInfo::QFileInfo((QFileInfo *)(local_188 + 0x40));
                if (local_110.size != 0) {
                  lVar27 = local_110.size * 0x30;
                  pPVar28 = local_110.ptr;
                  do {
                    lVar27 = lVar27 + -0x30;
                    local_188._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_188._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_188._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    ProString::toQString((QString *)local_188,pPVar28);
                    QVar26.ucs = (char16_t)(QString *)local_188;
                    cVar12 = QString::endsWith(QVar26,0x2f);
                    if (cVar12 == '\0') {
                      QString::append(QVar26);
                    }
                    local_d8._0_8_ =
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)0x1d;
                    local_d8._8_8_ = "../plugins/platforms/qwindows";
                    local_d8._16_8_ = &local_278;
                    local_d8._24_8_ =
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                          *)0x4;
                    local_d8._32_8_ = ".dll";
                    ::operator+=((QString *)local_188,
                                 (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>
                                  *)local_d8);
                    QFileInfo::QFileInfo((QFileInfo *)local_d8,(QString *)local_188);
                    pDVar6 = local_148.d;
                    local_148.d = (Data *)local_d8._0_8_;
                    local_d8._0_8_ = pDVar6;
                    QFileInfo::~QFileInfo((QFileInfo *)local_d8);
                    bVar15 = QFileInfo::exists();
                    if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                         *)local_188._0_8_ !=
                        (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                         *)0x0) {
                      LOCK();
                      *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                  *)local_188._0_8_)->a).a.a.a.d.d =
                           *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                       *)local_188._0_8_)->a).a.a.a.d.d + -1;
                      UNLOCK();
                      if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                      *)local_188._0_8_)->a).a.a.a.d.d == 0) {
                        QArrayData::deallocate((QArrayData *)local_188._0_8_,2,0x10);
                      }
                    }
                    pPVar28 = pPVar28 + 1;
                  } while ((bVar15 | lVar27 == 0) != 1);
                }
                bVar15 = QFileInfo::exists();
                if (bVar15 != 0) {
                  QFileInfo::absolutePath();
                  QDir::toNativeSeparators((QString *)local_188);
                  local_98 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                              *)local_188._16_8_;
                  pQStack_a0 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                                *)local_188._8_8_;
                  local_a8 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                              *)local_188._0_8_;
                  local_188._16_8_ =
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x0;
                  local_d8._0_8_ = &DAT_00000008;
                  local_d8._8_8_ = "qwindows";
                  local_d8._16_8_ = &local_278;
                  local_d8._24_8_ =
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x4;
                  local_d8._32_8_ = ".dll";
                  local_d8[0x28] = 0x7c;
                  local_188._0_8_ =
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x0;
                  local_188._8_8_ =
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)0x0;
                  local_90 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                              *)CONCAT71(local_90._1_7_,0x7c);
                  local_88 = (QString *)local_f8;
                  local_80 = 10;
                  local_78 = "\\platforms";
                  local_70 = 3;
                  local_68 = "|0;";
                  ::operator+=(pQVar19,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
                                        *)local_d8);
                  if (local_a8 !=
                      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)0x0) {
                    LOCK();
                    *(int *)&(local_a8->a).a.a.a.a.d.d = *(int *)&(local_a8->a).a.a.a.a.d.d + -1;
                    UNLOCK();
                    if (*(int *)&(local_a8->a).a.a.a.a.d.d == 0) {
                      QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
                    }
                  }
                  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)local_188._0_8_ !=
                      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)0x0) {
                    LOCK();
                    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                *)local_188._0_8_)->a).a.a.a.d.d =
                         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                     *)local_188._0_8_)->a).a.a.a.d.d + -1;
                    UNLOCK();
                    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                    *)local_188._0_8_)->a).a.a.a.d.d == 0) {
                      QArrayData::deallocate((QArrayData *)local_188._0_8_,2,0x10);
                    }
                  }
                  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)local_1c8._0_8_ !=
                      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)0x0) {
                    LOCK();
                    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                *)local_1c8._0_8_)->a).a.a.a.d.d =
                         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                     *)local_1c8._0_8_)->a).a.a.a.d.d + -1;
                    UNLOCK();
                    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                    *)local_1c8._0_8_)->a).a.a.a.d.d == 0) {
                      QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
                    }
                  }
                }
                QFileInfo::~QFileInfo((QFileInfo *)(local_188 + 0x40));
              }
              if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)local_278.a.a.a.a.a.d.d !=
                  (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)0x0) {
                LOCK();
                *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                     *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                 *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
                UNLOCK();
                if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0)
                {
                  QArrayData::deallocate(&(local_278.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_298);
        }
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_128.d !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate(&(local_128.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar25 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)&(pQVar25->a).b;
      } while (pQVar25 !=
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                *)(&((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_58.ptr)->m_string)->a + local_58.size));
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  }
  pQVar1 = (pVVar41->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_d8,"INSTALLS");
  pQVar20 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8)->
             super_QList<ProString>;
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_d8._0_8_ !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)local_d8._0_8_)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)local_d8._0_8_)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
    }
  }
  iVar21 = QList<ProString>::begin(pQVar20);
  iVar22 = QList<ProString>::end(pQVar20);
  if (iVar21.i != iVar22.i) {
    pQVar19 = &(pVVar41->vcProject).Configuration.deployment.AdditionalFiles;
    uVar43 = SUB81(pQVar19,0);
    uVar44 = (undefined7)((ulong)pQVar19 >> 8);
    do {
      local_188._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_188._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_188._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (pVVar41->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      local_1c8._8_8_ = ".path";
      local_1c8._0_8_ = iVar21.i;
      ProString::ProString<ProString_const&,char_const(&)[6]>
                ((ProString *)&local_278,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)local_1c8);
      QMakeEvaluator::first
                ((ProString *)local_d8,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_278);
      ProString::toQString((QString *)local_188,(ProString *)local_d8);
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_d8._0_8_ !=
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        LOCK();
        *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d =
             *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                         *)local_d8._0_8_)->a).a.a.a.d.d + -1;
        UNLOCK();
        if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
        }
      }
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_278.a.a.a.a.a.d.d !=
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        LOCK();
        *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
             *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                         *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
        UNLOCK();
        if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
          QArrayData::deallocate(&(local_278.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_188._16_8_ ==
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        QString::operator=((QString *)local_188,(QString *)local_f8);
      }
      uVar16 = *(ushort *)
                &(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_188._8_8_)->a).a.a.a.d.d - 0x25;
      flags = (uchar)(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>,_const_char_(&)[4]>
                      *)local_d8;
      if ((0x37 < uVar16) || ((0x80000000000401U >> ((ulong)uVar16 & 0x3f) & 1) == 0)) {
        local_58.d = (Data *)local_f8;
        local_58.ptr = (ProString *)CONCAT71(local_58.ptr._1_7_,0x5c);
        local_58.size = (qsizetype)local_188;
        QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&>::convertTo<QString>
                  ((QString *)local_1c8,
                   (QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&> *)&local_58);
        local_d8._0_8_ = local_1c8._0_8_;
        local_d8._8_8_ = local_1c8._8_8_;
        local_d8._16_8_ = local_1c8._16_8_;
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_1c8._0_8_ !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_1c8._0_8_)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)local_1c8._0_8_)->a).a.a.a.d.d + 1;
          UNLOCK();
        }
        string.d.ptr._0_1_ = uVar43;
        string.d.d = (Data *)pVVar41;
        string.d.ptr._1_7_ = uVar44;
        string.d.size = (qsizetype)iVar21.i;
        Option::fixString((QString *)&local_278,string,flags);
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_d8._0_8_ !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_d8._0_8_)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)local_d8._0_8_)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
          }
        }
        uVar5 = local_188._8_8_;
        uVar4 = local_188._0_8_;
        qVar3 = local_278.a.a.a.a.a.d.size;
        pDVar2 = local_278.a.a.a.a.a.d.d;
        local_278.a.a.a.a.a.d.d = (Data *)local_188._0_8_;
        local_188._0_8_ = pDVar2;
        local_188._8_8_ = local_278.a.a.a.a.a.d.ptr;
        local_278.a.a.a.a.a.d.ptr = (char16_t *)uVar5;
        local_278.a.a.a.a.a.d.size = local_188._16_8_;
        local_188._16_8_ = qVar3;
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)uVar4 !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)uVar4)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)uVar4)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)uVar4)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
          }
        }
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_1c8._0_8_ !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_1c8._0_8_)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)local_1c8._0_8_)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_1c8._0_8_)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
          }
        }
      }
      pQVar1 = (pVVar41->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      local_278.a.a.a.a.a.d.ptr = L".files";
      local_278.a.a.a.a.a.d.d = (Data *)iVar21.i;
      ProString::ProString<ProString_const&,char_const(&)[7]>
                ((ProString *)local_d8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_278);
      pQVar20 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_d8)->
                 super_QList<ProString>;
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_d8._0_8_ !=
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        LOCK();
        *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_d8._0_8_)->a).a.a.a.d.d =
             *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                         *)local_d8._0_8_)->a).a.a.a.d.d + -1;
        UNLOCK();
        if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
        }
      }
      this_00 = QList<ProString>::begin(pQVar20);
      iVar23 = QList<ProString>::end(pQVar20);
      pQVar25 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_1c8._0_8_;
      pQVar10 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_1c8._8_8_;
      pQVar11 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                 *)local_1c8._16_8_;
      local_1c8._0_8_ = local_188._0_8_;
      local_1c8._8_8_ = local_188._8_8_;
      local_1c8._16_8_ = local_188._16_8_;
      for (; local_188._0_8_ = local_1c8._0_8_, local_188._8_8_ = local_1c8._8_8_,
          local_188._16_8_ = local_1c8._16_8_, this_00.i != iVar23.i; this_00.i = this_00.i + 1) {
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_1c8._0_8_ !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                      *)local_1c8._0_8_)->a).a.a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                           *)local_1c8._0_8_)->a).a.a.a.a.d.d + 1;
          UNLOCK();
        }
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
        ProString::toQString((QString *)&local_278,this_00.i);
        local_d8._0_8_ = local_278.a.a.a.a.a.d.d;
        local_d8._8_8_ = local_278.a.a.a.a.a.d.ptr;
        local_d8._16_8_ = local_278.a.a.a.a.a.d.size;
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_278.a.a.a.a.a.d.d !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + 1;
          UNLOCK();
        }
        string_00.d.ptr._0_1_ = uVar43;
        string_00.d.d = (Data *)pVVar41;
        string_00.d.ptr._1_7_ = uVar44;
        string_00.d.size = (qsizetype)iVar21.i;
        Option::fixString((QString *)&local_58,string_00,flags);
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_d8._0_8_ !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_d8._0_8_)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)local_d8._0_8_)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
          }
        }
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_278.a.a.a.a.a.d.d !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate(&(local_278.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_128.size = 0;
        local_128.d = (Data *)0x0;
        local_128.ptr = (ProString *)0x0;
        local_210 = &DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo((QFileInfo *)&local_210,(QString *)&local_58);
        local_148.size = 0;
        local_148.d = (Data *)0x0;
        local_148.ptr = (ProString *)0x0;
        cVar12 = QFileInfo::isDir();
        if (cVar12 == '\0') {
          QFileInfo::fileName();
          uVar5 = local_d8._16_8_;
          uVar4 = local_d8._0_8_;
          pPVar28 = local_128.ptr;
          pDVar6 = local_128.d;
          local_d8._0_8_ = local_128.d;
          local_128.d = (Data *)uVar4;
          local_128.ptr = (ProString *)local_d8._8_8_;
          local_d8._8_8_ = pPVar28;
          local_d8._16_8_ = local_128.size;
          local_128.size = uVar5;
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)pDVar6 !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&pDVar6->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&pDVar6->super_QArrayData)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&pDVar6->super_QArrayData)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
            }
          }
          QFileInfo::absolutePath();
        }
        else {
          QVar40.m_data = "*";
          QVar40.m_size = 1;
          QString::operator=((QString *)&local_128,QVar40);
          QFileInfo::fileName();
          local_d8._24_8_ = local_278.a.a.a.a.a.d.size;
          local_d8._16_8_ = local_278.a.a.a.a.a.d.ptr;
          local_d8._8_8_ = local_278.a.a.a.a.a.d.d;
          local_d8._0_8_ = "\\";
          local_278.a.a.a.a.a.d.d = (Data *)0x0;
          local_278.a.a.a.a.a.d.ptr = (char16_t *)0x0;
          local_278.a.a.a.a.a.d.size = 0;
          ::operator+=((QString *)local_1c8,(QStringBuilder<const_char_(&)[2],_QString> *)local_d8);
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_d8._8_8_ !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_d8._8_8_)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)local_d8._8_8_)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)local_d8._8_8_)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_d8._8_8_,2,0x10);
            }
          }
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_278.a.a.a.a.a.d.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate(&(local_278.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          QFileInfo::absoluteFilePath();
        }
        uVar5 = local_d8._16_8_;
        uVar4 = local_d8._0_8_;
        pPVar28 = local_148.ptr;
        pDVar6 = local_148.d;
        local_d8._0_8_ = local_148.d;
        local_148.d = (Data *)uVar4;
        local_148.ptr = (ProString *)local_d8._8_8_;
        local_d8._8_8_ = pPVar28;
        local_d8._16_8_ = local_148.size;
        local_148.size = uVar5;
        if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
          }
        }
        qVar7 = local_128.size;
        pPVar28 = local_128.ptr;
        pDVar6 = local_128.d;
        qVar3 = local_148.size;
        local_218 = &DAT_aaaaaaaaaaaaaaaa;
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_128.d !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d + 1;
          UNLOCK();
        }
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._8_8_ = QArrayData::allocate((QArrayData **)local_d8,0x18,0x10,1,KeepSize);
        (((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_d8._8_8_)->a).a.a.a.a.d.d = (Data *)pDVar6;
        (((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_d8._8_8_)->a).a.a.a.a.d.ptr = (char16_t *)pPVar28;
        (((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_d8._8_8_)->a).a.a.a.a.d.size = qVar7;
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)pDVar6 ==
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          local_d8._16_8_ =
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                *)0x1;
          QDirListing::QDirListing
                    ((QDirListing *)&local_218,local_188 + 0x40,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>,_const_char_(&)[4]>
                      *)local_d8,0x438);
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_d8);
        }
        else {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&pDVar6->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&pDVar6->super_QArrayData)->a).a.a.a.d.d + 1;
          UNLOCK();
          local_d8._16_8_ =
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                *)0x1;
          QDirListing::QDirListing
                    ((QDirListing *)&local_218,local_188 + 0x40,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>,_const_char_(&)[4]>
                      *)local_d8,0x438);
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_d8);
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&pDVar6->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&pDVar6->super_QArrayData)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&pDVar6->super_QArrayData)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
          }
        }
        local_220.dirListPtr = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        for (local_220.dirListPtr = (QDirListingPrivate *)QDirListing::begin();
            local_220.dirListPtr != (QDirListingPrivate *)0x0;
            local_220.dirListPtr = (QDirListingPrivate *)QDirListing::next(local_220)) {
          local_1e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_1e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_1e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QDirListing::DirEntry::absolutePath();
          local_d8._0_8_ = local_278.a.a.a.a.a.d.d;
          local_d8._8_8_ = local_278.a.a.a.a.a.d.ptr;
          local_d8._16_8_ = local_278.a.a.a.a.a.d.size;
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_278.a.a.a.a.a.d.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + 1;
            UNLOCK();
          }
          string_01.d.ptr._0_1_ = uVar43;
          string_01.d.d = (Data *)pVVar41;
          string_01.d.ptr._1_7_ = uVar44;
          string_01.d.size = (qsizetype)iVar21.i;
          Option::fixString((QString *)local_1e8,string_01,flags);
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_d8._0_8_ !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_d8._0_8_)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)local_d8._0_8_)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)local_d8._0_8_)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
            }
          }
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_278.a.a.a.a.a.d.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&(local_278.a.a.a.a.a.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate(&(local_278.a.a.a.a.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          iVar29 = (int)local_1e8._16_8_ - (int)qVar3;
          QDirListing::DirEntry::fileName();
          pQVar11 = local_1f8;
          pQVar10 = pQStack_200;
          pQVar25 = local_208;
          local_208 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)0x0;
          pQStack_200 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                         *)0x0;
          local_1f8 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)0x0;
          if (iVar29 == 0) {
            QVar38.m_data = (storage_type *)0x0;
            QVar38.m_size = (qsizetype)local_d8;
            QString::fromLatin1(QVar38);
            local_298.d.d = (Data *)local_d8._0_8_;
            local_298.d.ptr = (char16_t *)local_d8._8_8_;
            local_298.d.size = local_d8._16_8_;
          }
          else {
            pQVar24 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                       *)(long)iVar29;
            if ((ulong)local_1e8._16_8_ < pQVar24 || local_1e8._16_8_ - (long)pQVar24 == 0) {
              local_298.d.d = (Data *)local_1e8._0_8_;
              local_298.d.ptr = (char16_t *)local_1e8._8_8_;
              local_298.d.size = local_1e8._16_8_;
              if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)local_1e8._0_8_ !=
                  (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)0x0) {
                LOCK();
                *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)local_1e8._0_8_)->a).a.a.a.d.d =
                     *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                                 *)local_1e8._0_8_)->a).a.a.a.d.d + 1;
                UNLOCK();
              }
            }
            else {
              QString::QString(&local_298,
                               (QChar *)((local_1e8._16_8_ - (long)pQVar24) * 2 + local_1e8._8_8_),
                               (longlong)pQVar24);
            }
          }
          local_90 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                      *)local_298.d.size;
          local_98 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                      *)local_298.d.ptr;
          pQStack_a0 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)local_298.d.d;
          local_278.a.a.a.a.b = (char (*) [2])0x2ac369;
          local_278.a.a.a.b = (QString *)local_1e8;
          local_278.a.a.b = (char (*) [2])0x2ac369;
          local_278.a.b = (QString *)local_1c8;
          local_298.d.size = 0;
          local_278.a.a.a.a.a.d.d = (Data *)0x0;
          local_278.a.a.a.a.a.d.ptr = (char16_t *)0x0;
          local_d8._0_8_ = pQVar25;
          local_d8._8_8_ = pQVar10;
          local_278.a.a.a.a.a.d.size = 0;
          local_d8._16_8_ = pQVar11;
          local_d8._24_8_ = "|";
          local_d8._40_8_ = "|";
          local_278.b.d.d = (Data *)0x0;
          local_278.b.d.ptr = (char16_t *)0x0;
          local_298.d.d = (Data *)0x0;
          local_298.d.ptr = (char16_t *)0x0;
          local_278.b.d.size = 0;
          local_88 = (QString *)0x2b4a01;
          local_d8._32_8_ = local_278.a.a.a.b;
          local_a8 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                      *)local_278.a.b;
          ::operator+=((QString *)CONCAT71(uVar44,uVar43),
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>,_const_char_(&)[4]>
                        *)local_d8);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                             *)local_d8);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
          ::~QStringBuilder(&local_278);
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_298.d.d !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)&(local_298.d.d)->super_QArrayData)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)&(local_298.d.d)->super_QArrayData)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)&(local_298.d.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate(&(local_298.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_208 !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(local_208->a).a.a.a.a.d.d = *(int *)&(local_208->a).a.a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(local_208->a).a.a.a.a.d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_208,2,0x10);
            }
          }
          if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)local_1e8._0_8_ !=
              (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
               *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                        *)local_1e8._0_8_)->a).a.a.a.d.d =
                 *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                             *)local_1e8._0_8_)->a).a.a.a.d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                            *)local_1e8._0_8_)->a).a.a.a.d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_1e8._0_8_,2,0x10);
            }
          }
        }
        QDirListing::~QDirListing((QDirListing *)&local_218);
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_148.d !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_148.d)->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&(local_148.d)->super_QArrayData)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_148.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate(&(local_148.d)->super_QArrayData,2,0x10);
          }
        }
        QFileInfo::~QFileInfo((QFileInfo *)&local_210);
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_128.d !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_128.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate(&(local_128.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_58.d !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)&(local_58.d)->super_QArrayData)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)&(local_58.d)->super_QArrayData)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)&(local_58.d)->super_QArrayData)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)local_1c8._0_8_ !=
            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
             *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                      *)local_1c8._0_8_)->a).a.a.a.d.d =
               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)local_1c8._0_8_)->a).a.a.a.d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                          *)local_1c8._0_8_)->a).a.a.a.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
          }
        }
        pQVar25 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)local_1c8._0_8_;
        pQVar10 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)local_1c8._8_8_;
        pQVar11 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                   *)local_1c8._16_8_;
        local_1c8._0_8_ = local_188._0_8_;
        local_1c8._8_8_ = local_188._8_8_;
        local_1c8._16_8_ = local_188._16_8_;
      }
      if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)local_1c8._0_8_ !=
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
           *)0x0) {
        LOCK();
        *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                    *)local_1c8._0_8_)->a).a.a.a.a.d.d =
             *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                         *)local_1c8._0_8_)->a).a.a.a.a.d.d + -1;
        UNLOCK();
        if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                        *)local_1c8._0_8_)->a).a.a.a.a.d.d == 0) {
          local_1c8._0_8_ = pQVar25;
          local_1c8._8_8_ = pQVar10;
          local_1c8._16_8_ = pQVar11;
          QArrayData::deallocate((QArrayData *)local_188._0_8_,2,0x10);
          pQVar25 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                     *)local_1c8._0_8_;
          pQVar10 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                     *)local_1c8._8_8_;
          pQVar11 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                     *)local_1c8._16_8_;
        }
      }
      local_1c8._16_8_ = pQVar11;
      local_1c8._8_8_ = pQVar10;
      local_1c8._0_8_ = pQVar25;
      iVar21.i = (ProString *)
                 &(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                     *)iVar21.i)->a).b;
    } while (iVar21.i != iVar22.i);
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_110);
  if ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)local_f8._0_8_ !=
      (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
       *)0x0) {
    LOCK();
    *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                *)local_f8._0_8_)->a).a.a.a.d.d =
         *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)local_f8._0_8_)->a).a.a.a.d.d + -1;
    UNLOCK();
    if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                    *)local_f8._0_8_)->a).a.a.a.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initDeploymentTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    QString targetPath;
    targetPath = project->values("deploy.path").join(' ');
    if (targetPath.isEmpty())
        targetPath = QString("%CSIDL_PROGRAM_FILES%\\") + project->first("TARGET");
    if (targetPath.endsWith("/") || targetPath.endsWith("\\"))
        targetPath.chop(1);
    conf.deployment.RemoteDirectory = targetPath;
    const ProStringList dllPaths = project->values("QMAKE_DLL_PATHS");
    // Only deploy Qt libs for shared build
    if (!dllPaths.isEmpty()) {
        // FIXME: This code should actually resolve the libraries from all Qt modules.
        ProStringList arg = project->values("LIBS") + project->values("LIBS_PRIVATE")
                + project->values("QMAKE_LIBS") + project->values("QMAKE_LIBS_PRIVATE");
        bool qpaPluginDeployed = false;
        for (ProStringList::ConstIterator it = arg.constBegin(); it != arg.constEnd(); ++it) {
            QString dllName = (*it).toQString();
            dllName.replace(QLatin1Char('\\'), QLatin1Char('/'));
            // LIBPATH isn't relevant for deployment
            if (dllName.startsWith(QLatin1String("/LIBPATH:")))
                continue;
            // We want to deploy .dlls not .libs
            if (dllName.endsWith(QLatin1String(".lib")))
                dllName.replace(dllName.size() - 3, 3, QLatin1String("dll"));
            // Use only the file name and check in Qt's install path and LIBPATHs to check for existence
            dllName.remove(0, dllName.lastIndexOf(QLatin1Char('/')) + 1);
            QFileInfo info;
            for (const ProString &dllPath : dllPaths) {
                QString absoluteDllFilePath = dllPath.toQString();
                if (!absoluteDllFilePath.endsWith(QLatin1Char('/')))
                    absoluteDllFilePath += QLatin1Char('/');
                absoluteDllFilePath += dllName;
                info = QFileInfo(absoluteDllFilePath);
                if (info.exists())
                    break;
            }

            if (!info.exists())
                continue;

            conf.deployment.AdditionalFiles += info.fileName()
                    + "|" + QDir::toNativeSeparators(info.absolutePath())
                    + "|" + targetPath
                    + "|0;";
            if (!qpaPluginDeployed) {
                QString debugInfix;
                bool foundGuid = dllName.contains(QLatin1String("Guid"));
                if (foundGuid)
                    debugInfix = QLatin1Char('d');

                if (foundGuid || dllName.contains(QLatin1String("Gui"))) {
                    QFileInfo info2;
                    for (const ProString &dllPath : dllPaths) {
                        QString absoluteDllFilePath = dllPath.toQString();
                        if (!absoluteDllFilePath.endsWith(QLatin1Char('/')))
                            absoluteDllFilePath += QLatin1Char('/');
                        absoluteDllFilePath += QLatin1String("../plugins/platforms/qwindows")
                                + debugInfix + QLatin1String(".dll");
                        info2 = QFileInfo(absoluteDllFilePath);
                        if (info2.exists())
                            break;
                    }
                    if (info2.exists()) {
                        conf.deployment.AdditionalFiles += QLatin1String("qwindows") + debugInfix + QLatin1String(".dll")
                                                    + QLatin1Char('|') + QDir::toNativeSeparators(info2.absolutePath())
                                                    + QLatin1Char('|') + targetPath + QLatin1String("\\platforms")
                                                    + QLatin1String("|0;");
                        qpaPluginDeployed = true;
                    }
                }
            }
        }
    }

    for (const ProString &item : project->values("INSTALLS")) {
        // get item.path
        QString devicePath = project->first(ProKey(item + ".path")).toQString();
        if (devicePath.isEmpty())
            devicePath = targetPath;
        // check if item.path is relative (! either /,\ or %)
        if (!(devicePath.at(0) == QLatin1Char('/')
            || devicePath.at(0) == QLatin1Char('\\')
            || devicePath.at(0) == QLatin1Char('%'))) {
            // create output path
            devicePath = Option::fixPathToTargetOS(targetPath + QLatin1Char('\\') + devicePath);
        }
        // foreach d in item.files
        for (const ProString &src : project->values(ProKey(item + ".files"))) {
            QString itemDevicePath = devicePath;
            QString source = Option::normalizePath(src.toQString());
            QString nameFilter;
            QFileInfo info(source);
            QString searchPath;
            if (info.isDir()) {
                nameFilter = QLatin1String("*");
                itemDevicePath += "\\" + info.fileName();
                searchPath = info.absoluteFilePath();
            } else {
                nameFilter = info.fileName();
                searchPath = info.absolutePath();
            }

            int pathSize = searchPath.size();
            using F = QDirListing::IteratorFlag;
            QDirListing dirList(searchPath, QStringList{nameFilter}, F::FilesOnly | F::ResolveSymlinks | F::Recursive);
            // foreach dirIterator-entry in d
            for (const auto &dirEntry : dirList) {
                const QString absoluteItemPath = Option::fixPathToTargetOS(dirEntry.absolutePath());
                // Identify if it is just another subdir
                int diffSize = absoluteItemPath.size() - pathSize;
                // write out rules
                conf.deployment.AdditionalFiles += dirEntry.fileName()
                        + "|" + absoluteItemPath
                        + "|" + itemDevicePath + (diffSize ? (absoluteItemPath.right(diffSize)) : QLatin1String(""))
                        + "|0;";
            }
        }
    }
}